

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O3

void linedebug_hunks(GlobalVars *gv,FILE *f,LinkedSection *ls)

{
  long lVar1;
  long lVar2;
  FILE *pFVar3;
  FILE *pFVar4;
  size_t sVar5;
  Section *sec;
  _IO_codecvt *p_Var6;
  long lVar7;
  
  pFVar4 = *(FILE **)f;
  while (pFVar3 = pFVar4, pFVar3 != (FILE *)0x0) {
    for (p_Var6 = f->_codecvt; p_Var6 != (_IO_codecvt *)0x0; p_Var6 = *(_IO_codecvt **)p_Var6) {
      if ((p_Var6[8] == (_IO_codecvt)0x1) && (p_Var6[9] == (_IO_codecvt)0x1)) {
        fwrite32be((FILE *)gv,0x3f1);
        sVar5 = strlen(*(char **)(p_Var6 + 0x10));
        fwrite32be((FILE *)gv,((int)sVar5 + 3 >> 2) + *(int *)(p_Var6 + 0x18) * 2 + 3);
        fwrite32be((FILE *)gv,*(uint32_t *)&f->_IO_buf_end);
        fwrite32be((FILE *)gv,0x4c494e45);
        hunk_name_len((FILE *)gv,*(char **)(p_Var6 + 0x10));
        if (*(int *)(p_Var6 + 0x18) != 0) {
          lVar1 = *(long *)(p_Var6 + 0x20);
          lVar2 = *(long *)(p_Var6 + 0x28);
          lVar7 = 0;
          do {
            fwrite32be((FILE *)gv,*(uint32_t *)(lVar1 + lVar7 * 4));
            fwrite32be((FILE *)gv,*(uint32_t *)(lVar2 + lVar7 * 4));
            lVar7 = lVar7 + 1;
          } while ((uint)lVar7 < *(uint *)(p_Var6 + 0x18));
        }
      }
    }
    f = pFVar3;
    pFVar4 = *(FILE **)pFVar3;
  }
  return;
}

Assistant:

static void linedebug_hunks(struct GlobalVars *gv,FILE *f,
                            struct LinkedSection *ls)
{
  struct Section *sec = (struct Section *)ls->sections.first;
  struct Section *nextsec;
  struct LineDebug *ldb;

  while (nextsec = (struct Section *)sec->n.next) {
    if (ldb = (struct LineDebug *)sec->special) {
      do {
        if (ldb->tgext.id==TGEXT_AMIGAOS && ldb->tgext.sub_id==SUBID_LINE) {
          uint32_t i,*lptr,*optr;

          fwrite32be(f,HUNK_DEBUG);
          fwrite32be(f,3 + strlen32(ldb->source_name) +
                     (ldb->num_entries<<1));
          fwrite32be(f,(uint32_t)sec->offset);
          fwrite32be(f,0x4c494e45);  /* "LINE" */
          hunk_name_len(f,ldb->source_name);
          for (i=0,lptr=ldb->lines,optr=ldb->offsets;
               i<ldb->num_entries; i++) {
            fwrite32be(f,*lptr++);
            fwrite32be(f,*optr++);
          }
        }
      }
      while (ldb = (struct LineDebug *)ldb->tgext.next);
    }
    sec = nextsec;
  }
}